

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

IReporter *
doctest::detail::reporterCreator<doctest::(anonymous_namespace)::XmlReporter>(ContextOptions *o)

{
  IReporter *pIVar1;
  ContextOptions *in_stack_ffffffffffffffe8;
  XmlReporter *in_stack_fffffffffffffff0;
  
  pIVar1 = (IReporter *)operator_new(0x88);
  anon_unknown_14::XmlReporter::XmlReporter(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return pIVar1;
}

Assistant:

IReporter* reporterCreator(const ContextOptions& o) {
        return new Reporter(o);
    }